

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_Writer::Write_Permute_(OSTEI_Writer *this,QAM *am,bool swap12,bool swap34)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ostream *poVar10;
  size_t sVar11;
  uint uVar12;
  undefined7 in_register_00000011;
  _Alloc_hider _Var13;
  char *__s;
  char *__s_00;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char vd;
  char vc;
  char vb;
  char va;
  undefined1 local_208 [16];
  _Alloc_hider local_1f8;
  size_type local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  size_t ncart_abcd;
  string idx;
  string fname;
  string local_168;
  ulong local_148;
  size_t ncart_cd;
  size_t ncart_bcd;
  size_t ncart_d;
  int local_128;
  int iStack_124;
  undefined8 uStack_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_208._0_8_ = *(undefined8 *)(am->qam)._M_elems;
  local_208._8_8_ = *(undefined8 *)((am->qam)._M_elems + 2);
  local_1f8._M_p = local_1e8;
  pcVar3 = (am->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar3,pcVar3 + (am->tag)._M_string_length);
  if ((int)CONCAT71(in_register_00000011,swap12) != 0) {
    iVar14 = SUB84(local_208._0_8_,4);
    local_208._4_4_ = (int)local_208._0_8_;
    local_208._0_4_ = iVar14;
  }
  if (swap34) {
    uVar8 = local_208._8_4_;
    uVar9 = local_208._12_4_;
    local_208._12_4_ = local_208._8_4_;
    local_208._8_4_ = uVar9;
    if (uVar9 == uVar8 && !swap12) goto LAB_0012a5bb;
  }
  if ((swap12 && !swap34) && (local_208._0_4_ == local_208._4_4_)) goto LAB_0012a5bb;
  if (swap12 && swap34) {
    if (local_208._0_4_ == local_208._4_4_) goto LAB_0012a5bb;
    if (local_208._8_4_ == local_208._12_4_) goto LAB_0012a5bb;
  }
  poVar10 = (this->super_OSTEI_Writer_Base).os_;
  local_98._0_8_ = local_208._0_8_;
  local_98._8_8_ = local_208._8_8_;
  _Var13._M_p = local_1f8._M_p;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_1f8._M_p,local_1f8._M_p + local_1f0);
  FunctionPrototype__abi_cxx11_(&fname,(OSTEI_Writer *)_Var13._M_p,(QAM *)local_98);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,fname._M_dataplus._M_p,fname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"{\n",2);
  if (swap12) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"double P_AB[3*P.nshell12];\n",0x1b);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"struct simint_multi_shellpair P_tmp = P;\n",0x29);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n",0x41);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n",0x41);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"P_tmp.AB_x = P_AB;\n",0x13);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"P_tmp.AB_y = P_AB + P.nshell12;\n",0x20);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"P_tmp.AB_z = P_AB + 2*P.nshell12;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"for(int i = 0; i < P.nshell12; i++)\n",0x24);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"P_tmp.AB_x[i] = -P.AB_x[i];\n",0x1c)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"P_tmp.AB_y[i] = -P.AB_y[i];\n",0x1c)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"P_tmp.AB_z[i] = -P.AB_z[i];\n",0x1c)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n\n",3);
    __s = "P_tmp";
  }
  else {
    __s = "P";
  }
  if (swap34) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"double Q_AB[3*Q.nshell12];\n",0x1b);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"struct simint_multi_shellpair Q_tmp = Q;\n",0x29);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n",0x41);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n",0x41);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Q_tmp.AB_x = Q_AB;\n",0x13);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Q_tmp.AB_y = Q_AB + Q.nshell12;\n",0x20);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"for(int i = 0; i < Q.nshell12; i++)\n",0x24);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Q_tmp.AB_x[i] = -Q.AB_x[i];\n",0x1c)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Q_tmp.AB_y[i] = -Q.AB_y[i];\n",0x1c)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Q_tmp.AB_z[i] = -Q.AB_z[i];\n",0x1c)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n\n",3);
    __s_00 = "Q_tmp";
  }
  else {
    __s_00 = "Q";
  }
  local_f8 = *(undefined8 *)(am->qam)._M_elems;
  uStack_f0 = *(undefined8 *)((am->qam)._M_elems + 2);
  pcVar3 = (am->tag)._M_dataplus._M_p;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar3,pcVar3 + (am->tag)._M_string_length);
  StringBuilder<char[7],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (&fname,(char (*) [7])"ostei_",
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (int)local_f8,
             (char (*) [2])0x14accb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_f8._4_4_,
             (char (*) [2])0x14accb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (int)uStack_f0,
             (char (*) [2])0x14accb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + uStack_f0._4_4_);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                       indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"int ret = ",10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,fname._M_dataplus._M_p,fname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
  sVar11 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  sVar11 = strlen(__s_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s_00,sVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", screen_tol, ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"work, ",6);
  local_1d8._0_8_ = local_1d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"");
  ArrVarName(&idx,(QAM *)local_208,(string *)local_1d8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,idx._M_dataplus._M_p,idx._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)idx._M_dataplus._M_p != &idx.field_2) {
    operator_delete(idx._M_dataplus._M_p);
  }
  if ((ostream *)local_1d8._0_8_ != (ostream *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_);
  }
  local_128 = local_208._0_4_;
  iStack_124 = local_208._4_4_;
  uStack_120 = local_208._8_8_;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,local_1f8._M_p,local_1f8._M_p + local_1f0);
  if ((((local_128 != 0) || (iStack_124 < 1)) ||
      ((bVar7 = true, (int)uStack_120 != 0 && (uStack_120._4_4_ != 0)))) &&
     ((((int)uStack_120 != 0 || (uStack_120._4_4_ < 1)) ||
      ((bVar7 = true, local_128 != 0 && (iStack_124 != 0)))))) {
    bVar7 = false;
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if (!bVar7) {
    local_68 = *(undefined8 *)(am->qam)._M_elems;
    uStack_60 = *(undefined8 *)((am->qam)._M_elems + 2);
    pcVar3 = (am->tag)._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar3,pcVar3 + (am->tag)._M_string_length);
    auVar15._0_4_ = (int)local_68 + 2;
    auVar15._4_4_ = local_68._4_4_ + 2;
    auVar15._8_4_ = (int)uStack_60 + 2;
    auVar15._12_4_ = uStack_60._4_4_ + 2;
    auVar16._4_4_ = local_68._4_4_ + 1;
    auVar16._12_4_ = uStack_60._4_4_ + 1;
    auVar16._0_4_ = auVar16._4_4_;
    auVar16._8_4_ = auVar16._12_4_;
    ncart_abcd = ((ulong)(~((int)uStack_60 >> 0x1f) &
                         (uint)((auVar15._8_8_ & 0xffffffff) * (ulong)((int)uStack_60 + 1)) >> 1) *
                  (ulong)(~((int)local_68 >> 0x1f) &
                         (uint)(auVar15._0_4_ * ((int)local_68 + 1)) >> 1) & 0xffffffff) *
                 ((ulong)(~(local_68._4_4_ >> 0x1f) & (uint)(auVar16._4_4_ * auVar15._4_4_) >> 1) *
                  (ulong)(~(uStack_60._4_4_ >> 0x1f) &
                         (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)auVar15._12_4_) >> 1) &
                 0xffffffff) & 0xffffffff;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    iVar14 = (am->qam)._M_elems[1];
    iVar2 = (am->qam)._M_elems[2];
    uVar12 = 0;
    uVar4 = (uint)((iVar14 + 1) * (iVar14 + 2)) >> 1;
    if (iVar14 < 0) {
      uVar4 = uVar12;
    }
    uVar5 = (uint)((iVar2 + 1) * (iVar2 + 2)) >> 1;
    if (iVar2 < 0) {
      uVar5 = uVar12;
    }
    iVar14 = (am->qam)._M_elems[3];
    uVar6 = (uint)((iVar14 + 1) * (iVar14 + 2)) >> 1;
    if (iVar14 < 0) {
      uVar6 = uVar12;
    }
    ncart_d = (size_t)uVar6;
    uVar6 = (uint)((local_208._12_4_ + 1) * (local_208._12_4_ + 2)) >> 1;
    if ((long)local_208._8_8_ < 0) {
      uVar6 = uVar12;
    }
    local_148 = (ulong)uVar6;
    ncart_cd = uVar5 * ncart_d;
    ncart_bcd = uVar4 * ncart_cd;
    va = 'a';
    vb = 'b';
    vc = 'c';
    vd = 'd';
    if (swap12) {
      va = 'b';
      vb = 'a';
    }
    if (swap34) {
      vc = 'd';
      vd = 'c';
    }
    StringBuilder<char[3],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
              (&idx,(char (*) [3])0x14d52f,&ncart_abcd,(char (*) [2])"+",&va,(char (*) [2])0x14daca,
               &ncart_bcd,(char (*) [2])"+",&vb,(char (*) [2])0x14daca,&ncart_cd,(char (*) [2])"+",
               &vc,(char (*) [2])0x14daca,&ncart_d,(char (*) [2])"+",&vd);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"double buffer[",0xe);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] SIMINT_ALIGN_ARRAY_DBL;\n\n",0x1b)
    ;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"for(int q = 0; q < ret; q++)\n",0x1d);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"int idx = 0;\n",0xd);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"for(int a = 0; a < ",0x13);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; ++a)\n",7);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"for(int b = 0; b < ",0x13);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; ++b)\n",7);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"for(int c = 0; c < ",0x13);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; ++c)\n",7);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"for(int d = 0; d < ",0x13);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; ++d)\n",7);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent3_abi_cxx11_._M_dataplus._M_p,
                         indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"buffer[idx++] = ",0x10);
    paVar1 = &local_168.field_2;
    local_168._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
    ArrVarName((string *)local_1d8,(QAM *)local_208,&local_168);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_1d8._0_8_,local_1d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,idx._M_dataplus._M_p,idx._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
    if ((ostream *)local_1d8._0_8_ != (ostream *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent2_abi_cxx11_._M_dataplus._M_p,
                         indent2_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"memcpy(",7);
    local_168._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
    ArrVarName((string *)local_1d8,(QAM *)local_208,&local_168);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_1d8._0_8_,local_1d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"+q*",3);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", buffer, ",10);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"*sizeof(double));\n",0x12);
    if ((ostream *)local_1d8._0_8_ != (ostream *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)idx._M_dataplus._M_p != &idx.field_2) {
      operator_delete(idx._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_OSTEI_Writer_Base).os_,indent1_abi_cxx11_._M_dataplus._M_p,
                       indent1_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"return ret;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n",1);
  poVar10 = (this->super_OSTEI_Writer_Base).osh_;
  local_c8._0_8_ = local_208._0_8_;
  local_c8._8_8_ = local_208._8_8_;
  _Var13._M_p = local_1f8._M_p;
  local_b8._M_p = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_1f8._M_p,local_1f8._M_p + local_1f0);
  FunctionPrototype__abi_cxx11_(&idx,(OSTEI_Writer *)_Var13._M_p,(QAM *)local_c8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,idx._M_dataplus._M_p,idx._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)idx._M_dataplus._M_p != &idx.field_2) {
    operator_delete(idx._M_dataplus._M_p);
  }
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
LAB_0012a5bb:
  if ((OSTEI_Writer *)local_1f8._M_p != (OSTEI_Writer *)local_1e8) {
    operator_delete(local_1f8._M_p);
  }
  return;
}

Assistant:

void OSTEI_Writer::Write_Permute_(QAM am, bool swap12, bool swap34) const
{
    QAM permuted = am;
    if(swap12)
        std::swap(permuted[0], permuted[1]);
    if(swap34)
        std::swap(permuted[2], permuted[3]);

    // is this permutation unique?
    if(swap34 && !swap12 && permuted[2] == permuted[3])
        return;
    if(swap12 && !swap34 && permuted[0] == permuted[1])
        return;
    if(swap12 && swap34 && (permuted[0] == permuted[1] || permuted[2] == permuted[3]))
        return;

    // output of the function starts here
    os_ << FunctionPrototype_(permuted) << "\n";
    os_ << "{\n";

    const char * P_var = "P";
    const char * Q_var = "Q";

    if(swap12)
    {
        P_var = "P_tmp";
        os_ << indent1 << "double P_AB[3*P.nshell12];\n";
        os_ << indent1 << "struct simint_multi_shellpair P_tmp = P;\n";
        os_ << indent1 << "P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n";
        os_ << indent1 << "P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n";
        os_ << indent1 << "P_tmp.AB_x = P_AB;\n";
        os_ << indent1 << "P_tmp.AB_y = P_AB + P.nshell12;\n";
        os_ << indent1 << "P_tmp.AB_z = P_AB + 2*P.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < P.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "P_tmp.AB_x[i] = -P.AB_x[i];\n";
        os_ << indent2 << "P_tmp.AB_y[i] = -P.AB_y[i];\n";
        os_ << indent2 << "P_tmp.AB_z[i] = -P.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    if(swap34)
    {
        Q_var = "Q_tmp";
        os_ << indent1 << "double Q_AB[3*Q.nshell12];\n";
        os_ << indent1 << "struct simint_multi_shellpair Q_tmp = Q;\n";
        os_ << indent1 << "Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n";
        os_ << indent1 << "Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n";
        os_ << indent1 << "Q_tmp.AB_x = Q_AB;\n";
        os_ << indent1 << "Q_tmp.AB_y = Q_AB + Q.nshell12;\n";
        os_ << indent1 << "Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < Q.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "Q_tmp.AB_x[i] = -Q.AB_x[i];\n";
        os_ << indent2 << "Q_tmp.AB_y[i] = -Q.AB_y[i];\n";
        os_ << indent2 << "Q_tmp.AB_z[i] = -Q.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    std::string fname = FunctionName_(am);
    os_ << indent1 << "int ret = " << fname
        << "(" << P_var << ", " << Q_var << ", screen_tol, "
        << "work, " << ArrVarName(permuted) << ");\n";


    if(!IsSpecialPermutation_(permuted))
    {
        size_t ncart_abcd = NCART(am);
        //size_t ncart_a  = NCART(am[0]);
        size_t ncart_b  = NCART(am[1]);
        size_t ncart_c  = NCART(am[2]);
        size_t ncart_d  = NCART(am[3]);
        size_t ncart_a2 = NCART(permuted[0]);
        size_t ncart_b2 = NCART(permuted[1]);
        size_t ncart_c2 = NCART(permuted[2]);
        size_t ncart_d2 = NCART(permuted[3]);

        size_t ncart_bcd = ncart_b * ncart_c * ncart_d;
        size_t ncart_cd = ncart_c * ncart_d;

        char va = 'a';
        char vb = 'b';
        char vc = 'c';
        char vd = 'd';

        if(swap12)
            std::swap(va, vb);
        if(swap34)
            std::swap(vc, vd);

        std::string idx = StringBuilder("q*", ncart_abcd,
                                        "+", va, "*", ncart_bcd,
                                        "+", vb, "*", ncart_cd,
                                        "+", vc, "*", ncart_d, "+", vd);

        os_ << indent1 << "double buffer[" << ncart_abcd << "] SIMINT_ALIGN_ARRAY_DBL;\n\n";


        os_ << indent1 << "for(int q = 0; q < ret; q++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "int idx = 0;\n";
        os_ << indent2 << "for(int a = 0; a < " << ncart_a2 << "; ++a)\n";
        os_ << indent2 << "for(int b = 0; b < " << ncart_b2 << "; ++b)\n";
        os_ << indent2 << "for(int c = 0; c < " << ncart_c2 << "; ++c)\n";
        os_ << indent2 << "for(int d = 0; d < " << ncart_d2 << "; ++d)\n";
        os_ << indent3 << "buffer[idx++] = " << ArrVarName(permuted) << "[" << idx << "];\n";
        os_ << "\n";
        os_ << indent2 << "memcpy(" << ArrVarName(permuted) << "+q*" << ncart_abcd
                       << ", buffer, " << ncart_abcd << "*sizeof(double));\n";
        os_ << indent1 << "}\n";
    }

    os_ << "\n";
    os_ << indent1 << "return ret;\n";
    os_ << "}\n";
    os_ << "\n";

    osh_ << FunctionPrototype_(permuted) << ";\n\n";
}